

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O2

void __thiscall
QAbstractItemViewPrivate::disconnectDelegate
          (QAbstractItemViewPrivate *this,QAbstractItemDelegate *delegate)

{
  offset_in_QAbstractItemView_to_subr slot;
  
  if (delegate != (QAbstractItemDelegate *)0x0) {
    slot = *(offset_in_QAbstractItemView_to_subr *)
            &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.
             field_0x8;
    QObject::
    disconnect<void(QAbstractItemDelegate::*)(QWidget*,QAbstractItemDelegate::EndEditHint),void(QAbstractItemView::*)(QWidget*,QAbstractItemDelegate::EndEditHint)>
              (delegate,(offset_in_QAbstractItemDelegate_to_subr)QAbstractItemDelegate::closeEditor,
               (Object *)0x0,slot);
    QObject::
    disconnect<void(QAbstractItemDelegate::*)(QWidget*),void(QAbstractItemView::*)(QWidget*)>
              (delegate,(offset_in_QAbstractItemDelegate_to_subr)QAbstractItemDelegate::commitData,
               (Object *)0x0,slot);
    QObjectPrivate::
    disconnect<void(QAbstractItemDelegate::*)(QModelIndex_const&),void(QAbstractItemViewPrivate::*)(QModelIndex_const&)>
              (delegate,(offset_in_QAbstractItemDelegate_to_subr)
                        QAbstractItemDelegate::sizeHintChanged,(Object *)0x0,(Function)this);
    return;
  }
  return;
}

Assistant:

void QAbstractItemViewPrivate::disconnectDelegate(QAbstractItemDelegate *delegate)
{
    if (!delegate)
        return;
    Q_Q(QAbstractItemView);
    QObject::disconnect(delegate, &QAbstractItemDelegate::closeEditor,
                        q, &QAbstractItemView::closeEditor);
    QObject::disconnect(delegate, &QAbstractItemDelegate::commitData,
                        q, &QAbstractItemView::commitData);
    QObjectPrivate::disconnect(delegate, &QAbstractItemDelegate::sizeHintChanged,
                               this, &QAbstractItemViewPrivate::delegateSizeHintChanged);
}